

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::forward
          (DeconvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar8;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  int *piVar12;
  void *pvVar13;
  Layer *pLVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  Mat *pMVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  _func_int *p_Var31;
  _func_int **pp_Var32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  float *pfVar37;
  int _h;
  _func_int *p_Var38;
  uint _elempack;
  int iVar39;
  int iVar40;
  void *pvVar41;
  undefined1 (*pauVar42) [32];
  undefined1 (*pauVar43) [16];
  int iVar44;
  int iVar45;
  uint uVar46;
  size_t sVar47;
  int _w;
  int iVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  float fVar55;
  float fVar65;
  float fVar66;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar79 [28];
  float fVar67;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar68 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar113 [16];
  float fVar111;
  float fVar112;
  float fVar128;
  float fVar130;
  float fVar132;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar131;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar127;
  float fVar129;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 in_ZMM7 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar141;
  undefined1 auVar140 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [32];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_2b8;
  ulong local_2a8;
  undefined1 local_298 [16];
  ulong local_280;
  int local_278;
  Mat local_238;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  long local_1d0;
  Mat *local_1c8;
  _func_int **local_1c0;
  Mat local_1b8;
  Mat *local_170;
  Mat local_168;
  long local_120;
  void *local_118;
  void *local_110;
  void *local_108;
  int *local_100;
  ulong local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  void *local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar96 [32];
  undefined1 auVar99 [32];
  undefined1 auVar126 [32];
  undefined1 auVar147 [64];
  
  uVar11 = bottom_blob->elemsize;
  iVar39 = bottom_blob->elempack;
  p_Var31 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  uVar24 = 1;
  if (opt->use_packing_layout == true) {
    uVar24 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var31) & 7) != 0) {
      uVar24 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var31) & 3) == 0) * 3 + 1;
    }
  }
  uVar3 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  auVar113._4_4_ = uVar8;
  auVar113._0_4_ = uVar3;
  uVar4 = *(ulong *)(&this->field_0xd4 + (long)p_Var31);
  uVar5 = *(ulong *)(&this->field_0xe4 + (long)p_Var31);
  uVar6 = *(ulong *)(&this->field_0xdc + (long)p_Var31);
  uVar7 = *(ulong *)(&this->field_0xfc + (long)p_Var31);
  uVar46 = bottom_blob->c;
  uVar35 = (ulong)uVar46;
  local_238.cstep = 0;
  auVar86 = (undefined1  [16])0x0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  p_Var38 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  p_Var31 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx + (long)p_Var38);
  lVar36 = 0x10;
  uStack_1e0 = 0;
  if (((((*(int *)(&this->field_0xec + (long)p_Var38) < 1) && (*(int *)(p_Var31 + 0xf0) < 1)) &&
       (*(int *)(p_Var31 + 0xf4) < 1)) && (*(int *)(p_Var31 + 0xf8) < 1)) &&
     ((*(int *)(p_Var31 + 0x104) < 1 || (*(int *)(p_Var31 + 0x108) < 1)))) {
    auVar86 = (undefined1  [16])0x0;
    if (&local_238 != top_blob) {
      piVar12 = top_blob->refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      local_238.data = top_blob->data;
      local_238.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_238.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_238.elemsize = top_blob->elemsize;
      local_238.elempack = top_blob->elempack;
      local_238.allocator = top_blob->allocator;
      auVar86._0_4_ = top_blob->dims;
      auVar86._4_4_ = top_blob->w;
      uVar9 = top_blob->h;
      uVar10 = top_blob->d;
      auVar86._8_8_ = CONCAT44(uVar10,uVar9);
      local_238.c = top_blob->c;
      local_238.cstep = top_blob->cstep;
      p_Var38 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
      local_238.dims = auVar86._0_4_;
      local_238.w = auVar86._4_4_;
      local_238._48_8_ = auVar86._8_8_;
    }
    p_Var31 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx + (long)p_Var38);
    lVar36 = 8;
  }
  auVar113._8_8_ = 0;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar7;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar5;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar4;
  auVar107 = ZEXT864(uVar6);
  auVar143 = vpcmpeqd_avx(auVar86,auVar86);
  auVar86 = vpaddd_avx(auVar113,auVar143);
  auVar86 = vpmulld_avx(auVar102,auVar86);
  auVar86 = vpaddd_avx(auVar86,auVar105);
  auVar113 = vpaddd_avx(auVar68,auVar143);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar6;
  auVar113 = vpmulld_avx(auVar113,auVar84);
  auVar86 = vpaddd_avx(auVar113,auVar86);
  local_298 = vpsubd_avx(auVar86,auVar143);
  sVar47 = (uVar11 / (ulong)(long)iVar39) * (ulong)uVar24;
  _w = local_298._0_4_;
  _h = local_298._4_4_;
  local_1e8._0_4_ = uVar3;
  local_1e8._4_4_ = uVar8;
  local_170 = top_blob;
  Mat::create(&local_238,_w,_h,*(int *)(p_Var31 + 0xd0) / (int)uVar24,sVar47,uVar24,
              *(Allocator **)(&opt->lightmode + lVar36));
  iVar33 = local_1e8._4_4_;
  iVar28 = (int)local_1e8;
  pvVar41 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
  iVar40 = -100;
  local_1e8 = pvVar41;
  if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
  goto LAB_0045c11b;
  p_Var31 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  iVar23 = iVar39 * uVar46;
  iVar40 = *(int *)(&this->field_0x114 + (long)p_Var31);
  if ((iVar23 == iVar40) && (iVar23 == *(int *)(&this->field_0xd0 + (long)p_Var31))) {
    iVar23 = *(int *)(&this->field_0xd8 + (long)p_Var31) *
             *(int *)(&this->field_0xd4 + (long)p_Var31);
    iVar48 = auVar113._0_4_;
    iVar40 = auVar113._4_4_;
    local_1c8 = bottom_blob;
    if (iVar39 == 1) {
      if (0 < (int)uVar46) {
        local_1d0 = local_238.cstep * local_238.elemsize;
        local_110 = local_238.data;
        pvVar13 = (this->weight_data_tm).data;
        iVar39 = bottom_blob->w;
        local_118 = bottom_blob->data;
        sVar47 = bottom_blob->elemsize;
        local_120 = bottom_blob->cstep * sVar47;
        auVar86 = vpcmpgtd_avx(local_298,(undefined1  [16])0x0);
        auVar86 = vpmovsxdq_avx(auVar86);
        uVar24 = vmovmskpd_avx(auVar86);
        local_1c8 = (Mat *)CONCAT71((int7)((ulong)bottom_blob >> 8),(byte)uVar24 >> 1);
        local_280 = 0;
        do {
          if ((char)local_1c8 != '\0') {
            pvVar41 = (void *)(local_120 * local_280 + (long)local_118);
            pfVar37 = (float *)(local_1d0 * local_280 + (long)local_110);
            local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_avx;
            iVar44 = 0;
            do {
              if ((uVar24 & 1) != 0) {
                iVar45 = 0;
                local_298._0_4_ = -iVar48;
                do {
                  p_Var31 = local_1c0[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var31) == 0) {
                    auVar107 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar107 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var31) +
                                                local_280 * 4));
                  }
                  auVar86 = auVar107._0_16_;
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var31)) {
                    iVar25 = 0;
                    do {
                      iVar26 = *(int *)(&this->field_0xe0 + (long)p_Var31) * iVar25 +
                               (iVar44 - iVar40);
                      if (((-1 < iVar26) &&
                          (iVar27 = iVar26 / *(int *)(&this->field_0xe8 + (long)p_Var31),
                          iVar26 % *(int *)(&this->field_0xe8 + (long)p_Var31) == 0)) &&
                         (iVar27 < iVar33)) {
                        iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var31);
                        if (0 < (long)iVar26) {
                          lVar36 = 0;
                          iVar34 = local_298._0_4_;
                          do {
                            if (((-1 < iVar34) &&
                                (iVar30 = iVar34 / *(int *)(&this->field_0xe4 + (long)p_Var31),
                                iVar34 % *(int *)(&this->field_0xe4 + (long)p_Var31) == 0)) &&
                               (iVar30 < iVar28)) {
                              auVar107 = ZEXT464((uint)(*(float *)((long)pvVar13 +
                                                                  lVar36 * 4 +
                                                                  (ulong)(uint)(iVar26 * iVar25) * 4
                                                                  ) *
                                                        *(float *)((long)pvVar41 +
                                                                  (long)iVar30 * 4 +
                                                                  (long)iVar27 *
                                                                  (long)iVar39 * sVar47) +
                                                       auVar107._0_4_));
                            }
                            lVar36 = lVar36 + 1;
                            iVar34 = iVar34 + *(int *)(&this->field_0xdc + (long)p_Var31);
                          } while (iVar26 != lVar36);
                        }
                      }
                      auVar86 = auVar107._0_16_;
                      iVar25 = iVar25 + 1;
                    } while (iVar25 != *(int *)(&this->field_0xd8 + (long)p_Var31));
                  }
                  fVar101 = auVar86._0_4_;
                  fVar49 = fVar101;
                  local_1e8 = pvVar41;
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var31)) {
                  case 1:
                    auVar86 = vmaxss_avx(auVar86,ZEXT416(0));
                    fVar49 = auVar86._0_4_;
                    break;
                  case 2:
                    auVar86 = vcmpss_avx(ZEXT816(0) << 0x40,auVar86,1);
                    auVar78._8_4_ = 0x3f800000;
                    auVar78._0_8_ = 0x3f8000003f800000;
                    auVar78._12_4_ = 0x3f800000;
                    auVar86 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var31))
                                            ,auVar78,auVar86);
                    fVar49 = auVar86._0_4_ * fVar101;
                    break;
                  case 3:
                    fVar101 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var31))[1];
                    auVar86 = vmaxss_avx(auVar86,ZEXT416(**(uint **)(&this->field_0x120 +
                                                                    (long)p_Var31)));
                    fVar49 = auVar86._0_4_;
                    if (fVar101 < auVar86._0_4_) {
                      fVar49 = fVar101;
                    }
                    break;
                  case 4:
                    auVar86 = vminss_avx(auVar86,ZEXT416(0x42b0c0a5));
                    auVar143._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                    auVar143._8_4_ = auVar86._8_4_ ^ 0x80000000;
                    auVar143._12_4_ = auVar86._12_4_ ^ 0x80000000;
                    auVar86 = vcmpss_avx(auVar86,ZEXT416(0xc2b0c0a5),1);
                    auVar77._8_4_ = 0x42b0c0a5;
                    auVar77._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar77._12_4_ = 0x42b0c0a5;
                    auVar86 = vblendvps_avx(auVar143,auVar77,auVar86);
                    fVar49 = expf(auVar86._0_4_);
                    fVar49 = 1.0 / (fVar49 + 1.0);
                    pvVar41 = local_1e8;
                    break;
                  case 5:
                    fVar49 = expf(fVar101);
                    fVar49 = logf(fVar49 + 1.0);
                    fVar49 = tanhf(fVar49);
                    fVar49 = fVar49 * fVar101;
                    pvVar41 = local_1e8;
                    break;
                  case 6:
                    fVar15 = **(float **)(&this->field_0x120 + (long)p_Var31);
                    fVar16 = (*(float **)(&this->field_0x120 + (long)p_Var31))[1];
                    fVar55 = -fVar16 / fVar15;
                    fVar49 = 0.0;
                    if ((fVar55 <= fVar101) && (fVar49 = fVar101, fVar101 <= fVar55 + 1.0 / fVar15))
                    {
                      fVar49 = (fVar15 * fVar101 + fVar16) * fVar101;
                    }
                  }
                  *pfVar37 = fVar49;
                  pfVar37 = pfVar37 + 1;
                  iVar45 = iVar45 + 1;
                  local_298._0_4_ = local_298._0_4_ + 1;
                } while (iVar45 != _w);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != _h);
          }
          local_280 = local_280 + 1;
          pvVar13 = (void *)((long)pvVar13 + (long)iVar23 * 4);
        } while (local_280 != uVar35);
      }
    }
    else if (iVar39 == 4) {
      if (0 < (int)uVar46) {
        auVar86 = vpcmpgtd_avx(local_298,(undefined1  [16])0x0);
        auVar86 = vpmovsxdq_avx(auVar86);
        uVar24 = vmovmskpd_avx(auVar86);
        bVar22 = (byte)uVar24 >> 1;
        local_1d0 = CONCAT71(local_1d0._1_7_,bVar22);
        local_2a8 = 0;
        auVar108._8_4_ = 0x3f000000;
        auVar108._0_8_ = 0x3f0000003f000000;
        auVar108._12_4_ = 0x3f000000;
        auVar107 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (bVar22 != 0) {
            pvVar13 = (this->weight_data_tm).data;
            sVar47 = bottom_blob->elemsize;
            pvVar41 = (void *)(bottom_blob->cstep * local_2a8 * sVar47 + (long)bottom_blob->data);
            iVar39 = bottom_blob->w;
            pauVar43 = (undefined1 (*) [16])
                       (local_238.cstep * local_2a8 * local_238.elemsize + (long)local_238.data);
            local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_avx;
            iVar28 = 0;
            do {
              if ((uVar24 & 1) != 0) {
                iVar33 = 0;
                local_278 = -iVar48;
                do {
                  p_Var31 = local_1c0[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var31) == 0) {
                    auVar58 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar58 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var31) + local_2a8 * 0x10);
                  }
                  auVar54 = ZEXT1664(auVar58);
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var31)) {
                    iVar45 = 0;
                    iVar44 = 0;
                    do {
                      iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var31) * iVar44 +
                               (iVar28 - iVar40);
                      if (((-1 < iVar25) &&
                          (iVar26 = iVar25 / *(int *)(&this->field_0xe8 + (long)p_Var31),
                          iVar25 % *(int *)(&this->field_0xe8 + (long)p_Var31) == 0)) &&
                         (iVar26 < local_1e8._4_4_)) {
                        lVar36 = (long)*(int *)(&this->field_0xd4 + (long)p_Var31);
                        if (0 < lVar36) {
                          uVar46 = *(int *)(&this->field_0xd4 + (long)p_Var31) * iVar45;
                          iVar25 = local_278;
                          do {
                            if (((-1 < iVar25) &&
                                (iVar27 = iVar25 / *(int *)(&this->field_0xe4 + (long)p_Var31),
                                iVar25 % *(int *)(&this->field_0xe4 + (long)p_Var31) == 0)) &&
                               (iVar27 < (int)local_1e8)) {
                              pfVar1 = (float *)((long)pvVar13 +
                                                (ulong)uVar46 * 4 +
                                                (long)(iVar23 * 4 * (int)local_2a8) * 4);
                              pfVar37 = (float *)((long)pvVar41 +
                                                 (long)(iVar27 << 2) * 4 +
                                                 (long)iVar26 * (long)iVar39 * sVar47);
                              auVar54 = ZEXT1664(CONCAT412(pfVar1[3] * pfVar37[3] + auVar54._12_4_,
                                                           CONCAT48(pfVar1[2] * pfVar37[2] +
                                                                    auVar54._8_4_,
                                                                    CONCAT44(pfVar1[1] * pfVar37[1]
                                                                             + auVar54._4_4_,
                                                                             *pfVar1 * *pfVar37 +
                                                                             auVar54._0_4_))));
                            }
                            uVar46 = uVar46 + 4;
                            iVar25 = iVar25 + *(int *)(&this->field_0xdc + (long)p_Var31);
                            lVar36 = lVar36 + -1;
                          } while (lVar36 != 0);
                        }
                      }
                      auVar58 = auVar54._0_16_;
                      iVar44 = iVar44 + 1;
                      iVar45 = iVar45 + 4;
                    } while (iVar44 != *(int *)(&this->field_0xd8 + (long)p_Var31));
                  }
                  auVar86 = auVar107._0_16_;
                  fVar49 = auVar107._0_4_;
                  fVar101 = auVar107._4_4_;
                  fVar15 = auVar107._8_4_;
                  fVar16 = auVar107._12_4_;
                  fVar55 = auVar58._4_4_;
                  fVar65 = auVar58._8_4_;
                  fVar66 = auVar58._12_4_;
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var31)) {
                  case 1:
                    auVar58 = vmaxps_avx(auVar58,_DAT_00507030);
                    break;
                  case 2:
                    auVar86 = vmaxps_avx(auVar58,(undefined1  [16])0x0);
                    auVar113 = vminps_avx(auVar58,(undefined1  [16])0x0);
                    fVar49 = **(float **)(&this->field_0x120 + (long)p_Var31);
                    auVar58._0_4_ = fVar49 * auVar113._0_4_ + auVar86._0_4_;
                    auVar58._4_4_ = fVar49 * auVar113._4_4_ + auVar86._4_4_;
                    auVar58._8_4_ = fVar49 * auVar113._8_4_ + auVar86._8_4_;
                    auVar58._12_4_ = fVar49 * auVar113._12_4_ + auVar86._12_4_;
                    break;
                  case 3:
                    uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var31);
                    auVar119._4_4_ = uVar2;
                    auVar119._0_4_ = uVar2;
                    auVar119._8_4_ = uVar2;
                    auVar119._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var31))[1];
                    auVar151._4_4_ = uVar2;
                    auVar151._0_4_ = uVar2;
                    auVar151._8_4_ = uVar2;
                    auVar151._12_4_ = uVar2;
                    auVar86 = vmaxps_avx(auVar58,auVar119);
                    auVar58 = vminps_avx(auVar151,auVar86);
                    break;
                  case 4:
                    auVar59._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
                    auVar59._8_4_ = -fVar65;
                    auVar59._12_4_ = -fVar66;
                    auVar74._8_4_ = 0x42b0c0a5;
                    auVar74._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar74._12_4_ = 0x42b0c0a5;
                    auVar113 = vminps_avx(auVar59,auVar74);
                    auVar75._8_4_ = 0xc2b0c0a5;
                    auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar75._12_4_ = 0xc2b0c0a5;
                    auVar68 = vmaxps_avx(auVar113,auVar75);
                    auVar120._0_4_ = auVar68._0_4_ * 1.442695 + 0.5;
                    auVar120._4_4_ = auVar68._4_4_ * 1.442695 + 0.5;
                    auVar120._8_4_ = auVar68._8_4_ * 1.442695 + 0.5;
                    auVar120._12_4_ = auVar68._12_4_ * 1.442695 + 0.5;
                    auVar152._0_4_ = (int)auVar120._0_4_;
                    auVar152._4_4_ = (int)auVar120._4_4_;
                    auVar152._8_4_ = (int)auVar120._8_4_;
                    auVar152._12_4_ = (int)auVar120._12_4_;
                    auVar143 = vcvtdq2ps_avx(auVar152);
                    auVar113 = vcmpps_avx(auVar120,auVar143,1);
                    auVar113 = vandps_avx(auVar113,auVar86);
                    auVar113 = vsubps_avx(auVar143,auVar113);
                    fVar55 = auVar113._0_4_ * -0.6931472 + auVar68._0_4_;
                    fVar65 = auVar113._4_4_ * -0.6931472 + auVar68._4_4_;
                    fVar66 = auVar113._8_4_ * -0.6931472 + auVar68._8_4_;
                    fVar67 = auVar113._12_4_ * -0.6931472 + auVar68._12_4_;
                    auVar121._0_4_ = (int)auVar113._0_4_;
                    auVar121._4_4_ = (int)auVar113._4_4_;
                    auVar121._8_4_ = (int)auVar113._8_4_;
                    auVar121._12_4_ = (int)auVar113._12_4_;
                    auVar113 = vpslld_avx(auVar121,0x17);
                    auVar113 = vpaddd_avx(auVar113,auVar86);
                    auVar60._0_4_ =
                         (fVar55 * fVar55 *
                          (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) *
                             fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) +
                         fVar55 + fVar49) * auVar113._0_4_ + fVar49;
                    auVar60._4_4_ =
                         (fVar65 * fVar65 *
                          (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) *
                             fVar65 + 0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) +
                         fVar65 + fVar101) * auVar113._4_4_ + fVar101;
                    auVar60._8_4_ =
                         (fVar66 * fVar66 *
                          (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) *
                             fVar66 + 0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) +
                         fVar66 + fVar15) * auVar113._8_4_ + fVar15;
                    auVar60._12_4_ =
                         (fVar67 * fVar67 *
                          (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) *
                             fVar67 + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) +
                         fVar67 + fVar16) * auVar113._12_4_ + fVar16;
                    auVar113 = vrcpps_avx(auVar60);
                    fVar49 = auVar113._0_4_;
                    auVar61._0_4_ = auVar60._0_4_ * fVar49;
                    fVar101 = auVar113._4_4_;
                    auVar61._4_4_ = auVar60._4_4_ * fVar101;
                    fVar15 = auVar113._8_4_;
                    auVar61._8_4_ = auVar60._8_4_ * fVar15;
                    fVar16 = auVar113._12_4_;
                    auVar61._12_4_ = auVar60._12_4_ * fVar16;
                    auVar86 = vsubps_avx(auVar86,auVar61);
                    auVar58._0_4_ = fVar49 + fVar49 * auVar86._0_4_;
                    auVar58._4_4_ = fVar101 + fVar101 * auVar86._4_4_;
                    auVar58._8_4_ = fVar15 + fVar15 * auVar86._8_4_;
                    auVar58._12_4_ = fVar16 + fVar16 * auVar86._12_4_;
                    break;
                  case 5:
                    auVar103._8_4_ = 0x42b0c0a5;
                    auVar103._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar103._12_4_ = 0x42b0c0a5;
                    auVar113 = vminps_avx(auVar58,auVar103);
                    auVar137._8_4_ = 0xc2b0c0a5;
                    auVar137._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar137._12_4_ = 0xc2b0c0a5;
                    auVar68 = vmaxps_avx(auVar137,auVar113);
                    auVar142._0_4_ = auVar68._0_4_ * 1.442695 + 0.5;
                    auVar142._4_4_ = auVar68._4_4_ * 1.442695 + 0.5;
                    auVar142._8_4_ = auVar68._8_4_ * 1.442695 + 0.5;
                    auVar142._12_4_ = auVar68._12_4_ * 1.442695 + 0.5;
                    auVar149._0_4_ = (int)auVar142._0_4_;
                    auVar149._4_4_ = (int)auVar142._4_4_;
                    auVar149._8_4_ = (int)auVar142._8_4_;
                    auVar149._12_4_ = (int)auVar142._12_4_;
                    auVar143 = vcvtdq2ps_avx(auVar149);
                    auVar113 = vcmpps_avx(auVar142,auVar143,1);
                    auVar113 = vandps_avx(auVar113,auVar86);
                    auVar113 = vsubps_avx(auVar143,auVar113);
                    auVar150._0_4_ = auVar113._0_4_ * 0.6931472;
                    auVar150._4_4_ = auVar113._4_4_ * 0.6931472;
                    auVar150._8_4_ = auVar113._8_4_ * 0.6931472;
                    auVar150._12_4_ = auVar113._12_4_ * 0.6931472;
                    auVar143 = vsubps_avx(auVar68,auVar150);
                    fVar67 = auVar143._0_4_;
                    fVar111 = auVar143._4_4_;
                    fVar127 = auVar143._8_4_;
                    fVar129 = auVar143._12_4_;
                    auVar115._0_4_ = (int)auVar113._0_4_;
                    auVar115._4_4_ = (int)auVar113._4_4_;
                    auVar115._8_4_ = (int)auVar113._8_4_;
                    auVar115._12_4_ = (int)auVar113._12_4_;
                    auVar113 = vpslld_avx(auVar115,0x17);
                    auVar113 = vpaddd_avx(auVar113,auVar86);
                    auVar116._0_4_ =
                         (fVar67 + fVar49 +
                         fVar67 * fVar67 *
                         (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) *
                            fVar67 + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5)) *
                         auVar113._0_4_ + fVar49;
                    auVar116._4_4_ =
                         (fVar111 + fVar101 +
                         fVar111 * fVar111 *
                         (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) *
                            fVar111 + 0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) *
                         auVar113._4_4_ + fVar101;
                    auVar116._8_4_ =
                         (fVar127 + fVar15 +
                         fVar127 * fVar127 *
                         (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) *
                            fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) *
                         auVar113._8_4_ + fVar15;
                    auVar116._12_4_ =
                         (fVar129 + fVar16 +
                         fVar129 * fVar129 *
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) *
                         auVar113._12_4_ + fVar16;
                    auVar69._8_4_ = 0x800000;
                    auVar69._0_8_ = 0x80000000800000;
                    auVar69._12_4_ = 0x800000;
                    auVar113 = vmaxps_avx(auVar116,auVar69);
                    auVar143 = vpsrld_avx(auVar113,0x17);
                    auVar88._8_4_ = 0xffffff82;
                    auVar88._0_8_ = 0xffffff82ffffff82;
                    auVar88._12_4_ = 0xffffff82;
                    auVar143 = vpaddd_avx(auVar143,auVar88);
                    auVar89._8_4_ = 0x807fffff;
                    auVar89._0_8_ = 0x807fffff807fffff;
                    auVar89._12_4_ = 0x807fffff;
                    auVar113 = vandps_avx(auVar113,auVar89);
                    auVar84 = vorps_avx(auVar113,auVar108);
                    auVar68 = vcvtdq2ps_avx(auVar143);
                    auVar90._8_4_ = 0x3f3504f3;
                    auVar90._0_8_ = 0x3f3504f33f3504f3;
                    auVar90._12_4_ = 0x3f3504f3;
                    auVar143 = vcmpps_avx(auVar84,auVar90,1);
                    auVar113 = vandps_avx(auVar143,auVar84);
                    fVar67 = auVar84._0_4_ + -1.0 + auVar113._0_4_;
                    fVar111 = auVar84._4_4_ + -1.0 + auVar113._4_4_;
                    fVar127 = auVar84._8_4_ + -1.0 + auVar113._8_4_;
                    fVar129 = auVar84._12_4_ + -1.0 + auVar113._12_4_;
                    auVar113 = vandps_avx(auVar143,auVar86);
                    auVar143 = vsubps_avx(auVar68,auVar113);
                    auVar113 = vcmpps_avx(auVar116,_DAT_00507030,2);
                    auVar70._0_4_ =
                         (fVar67 * fVar67 *
                          (((((((((fVar67 * 0.070376836 + -0.1151461) * fVar67 + 0.116769984) *
                                 fVar67 + -0.12420141) * fVar67 + 0.14249323) * fVar67 + -0.16668057
                              ) * fVar67 + 0.20000714) * fVar67 + -0.24999994) * fVar67 + 0.3333333)
                           * fVar67 + -0.5) + auVar143._0_4_ * 0.6931472 + fVar67) * -2.0;
                    auVar70._4_4_ =
                         (fVar111 * fVar111 *
                          (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) *
                                 fVar111 + -0.12420141) * fVar111 + 0.14249323) * fVar111 +
                              -0.16668057) * fVar111 + 0.20000714) * fVar111 + -0.24999994) *
                            fVar111 + 0.3333333) * fVar111 + -0.5) +
                         auVar143._4_4_ * 0.6931472 + fVar111) * -2.0;
                    auVar70._8_4_ =
                         (fVar127 * fVar127 *
                          (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984) *
                                 fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127 +
                              -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994) *
                            fVar127 + 0.3333333) * fVar127 + -0.5) +
                         auVar143._8_4_ * 0.6931472 + fVar127) * -2.0;
                    auVar70._12_4_ =
                         (fVar129 * fVar129 *
                          (((((((((fVar129 * 0.070376836 + -0.1151461) * fVar129 + 0.116769984) *
                                 fVar129 + -0.12420141) * fVar129 + 0.14249323) * fVar129 +
                              -0.16668057) * fVar129 + 0.20000714) * fVar129 + -0.24999994) *
                            fVar129 + 0.3333333) * fVar129 + -0.5) +
                         auVar143._12_4_ * 0.6931472 + fVar129) * -2.0;
                    auVar91._8_4_ = 0x7fffffff;
                    auVar91._0_8_ = 0x7fffffff7fffffff;
                    auVar91._12_4_ = 0x7fffffff;
                    auVar113 = vblendvps_avx(auVar70,auVar91,auVar113);
                    auVar92._8_4_ = 0x42b0c0a5;
                    auVar92._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar92._12_4_ = 0x42b0c0a5;
                    auVar113 = vminps_avx(auVar113,auVar92);
                    auVar93._8_4_ = 0xc2b0c0a5;
                    auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar93._12_4_ = 0xc2b0c0a5;
                    auVar68 = vmaxps_avx(auVar113,auVar93);
                    auVar94._0_4_ = auVar68._0_4_ * 1.442695 + 0.5;
                    auVar94._4_4_ = auVar68._4_4_ * 1.442695 + 0.5;
                    auVar94._8_4_ = auVar68._8_4_ * 1.442695 + 0.5;
                    auVar94._12_4_ = auVar68._12_4_ * 1.442695 + 0.5;
                    auVar117._0_4_ = (int)auVar94._0_4_;
                    auVar117._4_4_ = (int)auVar94._4_4_;
                    auVar117._8_4_ = (int)auVar94._8_4_;
                    auVar117._12_4_ = (int)auVar94._12_4_;
                    auVar143 = vcvtdq2ps_avx(auVar117);
                    auVar113 = vcmpps_avx(auVar94,auVar143,1);
                    auVar113 = vandps_avx(auVar113,auVar86);
                    auVar113 = vsubps_avx(auVar143,auVar113);
                    auVar118._0_4_ = auVar113._0_4_ * 0.6931472;
                    auVar118._4_4_ = auVar113._4_4_ * 0.6931472;
                    auVar118._8_4_ = auVar113._8_4_ * 0.6931472;
                    auVar118._12_4_ = auVar113._12_4_ * 0.6931472;
                    auVar107 = ZEXT1664(auVar86);
                    auVar143 = vsubps_avx(auVar68,auVar118);
                    fVar67 = auVar143._0_4_;
                    fVar111 = auVar143._4_4_;
                    fVar127 = auVar143._8_4_;
                    fVar129 = auVar143._12_4_;
                    auVar95._0_4_ = (int)auVar113._0_4_;
                    auVar95._4_4_ = (int)auVar113._4_4_;
                    auVar95._8_4_ = (int)auVar113._8_4_;
                    auVar95._12_4_ = (int)auVar113._12_4_;
                    auVar113 = vpslld_avx(auVar95,0x17);
                    auVar86 = vpaddd_avx(auVar113,auVar86);
                    auVar71._0_4_ =
                         (fVar67 + fVar49 +
                         (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) *
                            fVar67 + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) *
                         fVar67 * fVar67) * auVar86._0_4_ + fVar49;
                    auVar71._4_4_ =
                         (fVar111 + fVar101 +
                         (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) *
                            fVar111 + 0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5) *
                         fVar111 * fVar111) * auVar86._4_4_ + fVar101;
                    auVar71._8_4_ =
                         (fVar127 + fVar15 +
                         (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) *
                            fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) *
                         fVar127 * fVar127) * auVar86._8_4_ + fVar15;
                    auVar71._12_4_ =
                         (fVar129 + fVar16 +
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) *
                         fVar129 * fVar129) * auVar86._12_4_ + fVar16;
                    auVar86 = vrcpps_avx(auVar71);
                    fVar49 = auVar86._0_4_;
                    fVar101 = auVar86._4_4_;
                    fVar15 = auVar86._8_4_;
                    fVar16 = auVar86._12_4_;
                    auVar72._0_4_ = auVar71._0_4_ * (fVar49 + fVar49);
                    auVar72._4_4_ = auVar71._4_4_ * (fVar101 + fVar101);
                    auVar72._8_4_ = auVar71._8_4_ * (fVar15 + fVar15);
                    auVar72._12_4_ = auVar71._12_4_ * (fVar16 + fVar16);
                    auVar104._8_4_ = 0x40000000;
                    auVar104._0_8_ = 0x4000000040000000;
                    auVar104._12_4_ = 0x40000000;
                    auVar86 = vsubps_avx(auVar104,auVar72);
                    auVar73._0_4_ = fVar49 + fVar49 + -1.0 + fVar49 * auVar86._0_4_;
                    auVar73._4_4_ = fVar101 + fVar101 + -1.0 + fVar101 * auVar86._4_4_;
                    auVar73._8_4_ = fVar15 + fVar15 + -1.0 + fVar15 * auVar86._8_4_;
                    auVar73._12_4_ = fVar16 + fVar16 + -1.0 + fVar16 * auVar86._12_4_;
                    goto LAB_0045bb35;
                  case 6:
                    fVar49 = **(float **)(&this->field_0x120 + (long)p_Var31);
                    fVar101 = (*(float **)(&this->field_0x120 + (long)p_Var31))[1];
                    auVar76._0_4_ = fVar49 * auVar58._0_4_ + fVar101;
                    auVar76._4_4_ = fVar49 * fVar55 + fVar101;
                    auVar76._8_4_ = fVar49 * fVar65 + fVar101;
                    auVar76._12_4_ = fVar49 * fVar66 + fVar101;
                    auVar113 = vmaxps_avx(auVar76,_DAT_00507030);
                    auVar73 = vminps_avx(auVar113,auVar86);
LAB_0045bb35:
                    auVar58._0_4_ = auVar73._0_4_ * auVar58._0_4_;
                    auVar58._4_4_ = auVar73._4_4_ * fVar55;
                    auVar58._8_4_ = auVar73._8_4_ * fVar65;
                    auVar58._12_4_ = auVar73._12_4_ * fVar66;
                  }
                  *pauVar43 = auVar58;
                  pauVar43 = pauVar43 + 1;
                  iVar33 = iVar33 + 1;
                  local_278 = local_278 + 1;
                } while (iVar33 != _w);
              }
              iVar28 = iVar28 + 1;
            } while (iVar28 != _h);
          }
          local_2a8 = local_2a8 + 1;
        } while (local_2a8 != uVar35);
      }
    }
    else if ((iVar39 == 8) && (0 < (int)uVar46)) {
      auVar86 = vpcmpgtd_avx(local_298,(undefined1  [16])0x0);
      auVar86 = vpmovsxdq_avx(auVar86);
      uVar24 = vmovmskpd_avx(auVar86);
      bVar22 = (byte)uVar24 >> 1;
      local_1d0 = CONCAT71(local_1d0._1_7_,bVar22);
      local_2a8 = 0;
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      auVar140 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar110 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar138._8_4_ = 0x42b0c0a5;
      auVar138._0_8_ = 0x42b0c0a542b0c0a5;
      auVar138._12_4_ = 0x42b0c0a5;
      auVar138._16_4_ = 0x42b0c0a5;
      auVar138._20_4_ = 0x42b0c0a5;
      auVar138._24_4_ = 0x42b0c0a5;
      auVar138._28_4_ = 0x42b0c0a5;
      auVar139._8_4_ = 0xc2b0c0a5;
      auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar139._12_4_ = 0xc2b0c0a5;
      auVar139._16_4_ = 0xc2b0c0a5;
      auVar139._20_4_ = 0xc2b0c0a5;
      auVar139._24_4_ = 0xc2b0c0a5;
      auVar139._28_4_ = 0xc2b0c0a5;
      do {
        if (bVar22 != 0) {
          pvVar13 = (this->weight_data_tm).data;
          sVar47 = bottom_blob->elemsize;
          pvVar41 = (void *)(bottom_blob->cstep * local_2a8 * sVar47 + (long)bottom_blob->data);
          iVar39 = bottom_blob->w;
          pauVar42 = (undefined1 (*) [32])
                     (local_238.cstep * local_2a8 * local_238.elemsize + (long)local_238.data);
          local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_avx;
          iVar28 = 0;
          do {
            if ((uVar24 & 1) != 0) {
              iVar33 = 0;
              local_278 = -iVar48;
              do {
                p_Var31 = local_1c0[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var31) == 0) {
                  auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar146 = ZEXT3264(*(undefined1 (*) [32])
                                       (*(long *)(&this->field_0x1b0 + (long)p_Var31) +
                                       local_2a8 * 0x20));
                }
                if (0 < *(int *)(&this->field_0xd8 + (long)p_Var31)) {
                  iVar45 = 0;
                  iVar44 = 0;
                  do {
                    iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var31) * iVar44 +
                             (iVar28 - iVar40);
                    if (((-1 < iVar25) &&
                        (iVar26 = iVar25 / *(int *)(&this->field_0xe8 + (long)p_Var31),
                        iVar25 % *(int *)(&this->field_0xe8 + (long)p_Var31) == 0)) &&
                       (iVar26 < local_1e8._4_4_)) {
                      lVar36 = (long)*(int *)(&this->field_0xd4 + (long)p_Var31);
                      if (0 < lVar36) {
                        uVar46 = *(int *)(&this->field_0xd4 + (long)p_Var31) * iVar45;
                        iVar25 = local_278;
                        do {
                          if (((-1 < iVar25) &&
                              (iVar27 = iVar25 / *(int *)(&this->field_0xe4 + (long)p_Var31),
                              iVar25 % *(int *)(&this->field_0xe4 + (long)p_Var31) == 0)) &&
                             (iVar27 < (int)local_1e8)) {
                            pfVar37 = (float *)((long)pvVar13 +
                                               (ulong)uVar46 * 4 +
                                               (long)(iVar23 * 8 * (int)local_2a8) * 4);
                            pfVar1 = (float *)((long)pvVar41 +
                                              (long)(iVar27 << 3) * 4 +
                                              (long)iVar26 * (long)iVar39 * sVar47);
                            auVar146 = ZEXT3264(CONCAT428(auVar146._28_4_ + pfVar37[7],
                                                          CONCAT424(auVar146._24_4_ +
                                                                    pfVar37[6] * pfVar1[6],
                                                                    CONCAT420(auVar146._20_4_ +
                                                                              pfVar37[5] * pfVar1[5]
                                                                              ,CONCAT416(auVar146.
                                                  _16_4_ + pfVar37[4] * pfVar1[4],
                                                  CONCAT412(auVar146._12_4_ + pfVar37[3] * pfVar1[3]
                                                            ,CONCAT48(auVar146._8_4_ +
                                                                      pfVar37[2] * pfVar1[2],
                                                                      CONCAT44(auVar146._4_4_ +
                                                                               pfVar37[1] *
                                                                               pfVar1[1],
                                                                               auVar146._0_4_ +
                                                                               *pfVar37 * *pfVar1)))
                                                  )))));
                          }
                          uVar46 = uVar46 + 8;
                          iVar25 = iVar25 + *(int *)(&this->field_0xdc + (long)p_Var31);
                          lVar36 = lVar36 + -1;
                        } while (lVar36 != 0);
                      }
                    }
                    iVar44 = iVar44 + 1;
                    iVar45 = iVar45 + 8;
                  } while (iVar44 != *(int *)(&this->field_0xd8 + (long)p_Var31));
                }
                auVar145 = auVar146._0_32_;
                fVar112 = auVar146._8_4_;
                fVar128 = auVar146._12_4_;
                fVar130 = auVar146._16_4_;
                fVar132 = auVar146._20_4_;
                fVar134 = auVar146._24_4_;
                fVar111 = auVar140._0_4_;
                fVar127 = auVar140._4_4_;
                fVar129 = auVar140._8_4_;
                fVar131 = auVar140._12_4_;
                fVar133 = auVar140._16_4_;
                fVar135 = auVar140._20_4_;
                fVar136 = auVar140._24_4_;
                fVar141 = auVar140._28_4_;
                auVar109 = auVar110._0_32_;
                fVar49 = auVar110._0_4_;
                fVar101 = auVar110._4_4_;
                fVar15 = auVar110._8_4_;
                fVar16 = auVar110._12_4_;
                fVar55 = auVar110._16_4_;
                fVar65 = auVar110._20_4_;
                fVar66 = auVar110._24_4_;
                fVar67 = auVar110._28_4_;
                auVar147._28_36_ = auVar146._28_36_;
                switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var31)) {
                case 1:
                  auVar145 = vmaxps_avx(auVar145,auVar54._0_32_);
                  break;
                case 2:
                  auVar109 = vmaxps_avx(auVar145,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  in_ZMM7 = ZEXT3264(auVar109);
                  auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar83 = vminps_avx(auVar145,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  fVar49 = **(float **)(&this->field_0x120 + (long)p_Var31);
                  auVar145._0_4_ = fVar49 * auVar83._0_4_ + auVar109._0_4_;
                  auVar145._4_4_ = fVar49 * auVar83._4_4_ + auVar109._4_4_;
                  auVar145._8_4_ = fVar49 * auVar83._8_4_ + auVar109._8_4_;
                  auVar145._12_4_ = fVar49 * auVar83._12_4_ + auVar109._12_4_;
                  auVar145._16_4_ = fVar49 * auVar83._16_4_ + auVar109._16_4_;
                  auVar145._20_4_ = fVar49 * auVar83._20_4_ + auVar109._20_4_;
                  auVar145._24_4_ = fVar49 * auVar83._24_4_ + auVar109._24_4_;
                  auVar145._28_4_ = auVar83._28_4_ + auVar109._28_4_;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var31);
                  auVar124._4_4_ = uVar2;
                  auVar124._0_4_ = uVar2;
                  auVar124._8_4_ = uVar2;
                  auVar124._12_4_ = uVar2;
                  auVar124._16_4_ = uVar2;
                  auVar124._20_4_ = uVar2;
                  auVar124._24_4_ = uVar2;
                  auVar124._28_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var31))[1];
                  auVar153._4_4_ = uVar2;
                  auVar153._0_4_ = uVar2;
                  auVar153._8_4_ = uVar2;
                  auVar153._12_4_ = uVar2;
                  auVar153._16_4_ = uVar2;
                  auVar153._20_4_ = uVar2;
                  auVar153._24_4_ = uVar2;
                  auVar153._28_4_ = uVar2;
                  auVar145 = vmaxps_avx(auVar145,auVar124);
                  in_ZMM7 = ZEXT3264(auVar145);
                  auVar145 = vminps_avx(auVar153,auVar145);
                  break;
                case 4:
                  auVar125._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
                  auVar125._8_4_ = -fVar112;
                  auVar125._12_4_ = -fVar128;
                  auVar125._16_4_ = -fVar130;
                  auVar125._20_4_ = -fVar132;
                  auVar125._24_4_ = -fVar134;
                  auVar125._28_4_ = -auVar146._28_4_;
                  auVar63._8_4_ = 0x42b0c0a5;
                  auVar63._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar63._12_4_ = 0x42b0c0a5;
                  auVar63._16_4_ = 0x42b0c0a5;
                  auVar63._20_4_ = 0x42b0c0a5;
                  auVar63._24_4_ = 0x42b0c0a5;
                  auVar63._28_4_ = 0x42b0c0a5;
                  auVar145 = vminps_avx(auVar125,auVar63);
                  auVar64._8_4_ = 0xc2b0c0a5;
                  auVar64._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar64._12_4_ = 0xc2b0c0a5;
                  auVar64._16_4_ = 0xc2b0c0a5;
                  auVar64._20_4_ = 0xc2b0c0a5;
                  auVar64._24_4_ = 0xc2b0c0a5;
                  auVar64._28_4_ = 0xc2b0c0a5;
                  auVar83 = vmaxps_avx(auVar145,auVar64);
                  auVar144._0_4_ = auVar83._0_4_ * 1.442695 + fVar111;
                  auVar144._4_4_ = auVar83._4_4_ * 1.442695 + fVar127;
                  auVar144._8_4_ = auVar83._8_4_ * 1.442695 + fVar129;
                  auVar144._12_4_ = auVar83._12_4_ * 1.442695 + fVar131;
                  auVar144._16_4_ = auVar83._16_4_ * 1.442695 + fVar133;
                  auVar144._20_4_ = auVar83._20_4_ * 1.442695 + fVar135;
                  auVar144._24_4_ = auVar83._24_4_ * 1.442695 + fVar136;
                  auVar144._28_4_ = auVar146._28_4_ + fVar141;
                  auVar100 = vroundps_avx(auVar144,1);
                  auVar145 = vcmpps_avx(auVar144,auVar100,1);
                  auVar145 = vandps_avx(auVar145,auVar109);
                  auVar145 = vsubps_avx(auVar100,auVar145);
                  fVar112 = auVar145._0_4_ * -0.6931472 + auVar83._0_4_;
                  fVar128 = auVar145._4_4_ * -0.6931472 + auVar83._4_4_;
                  fVar130 = auVar145._8_4_ * -0.6931472 + auVar83._8_4_;
                  fVar132 = auVar145._12_4_ * -0.6931472 + auVar83._12_4_;
                  fVar134 = auVar145._16_4_ * -0.6931472 + auVar83._16_4_;
                  fVar148 = auVar145._20_4_ * -0.6931472 + auVar83._20_4_;
                  fVar154 = auVar145._24_4_ * -0.6931472 + auVar83._24_4_;
                  auVar114._0_4_ = (int)auVar145._0_4_;
                  auVar114._4_4_ = (int)auVar145._4_4_;
                  auVar114._8_4_ = (int)auVar145._8_4_;
                  auVar114._12_4_ = (int)auVar145._12_4_;
                  auVar126._16_4_ = (int)auVar145._16_4_;
                  auVar126._0_16_ = auVar114;
                  auVar126._20_4_ = (int)auVar145._20_4_;
                  auVar126._24_4_ = (int)auVar145._24_4_;
                  auVar126._28_4_ = (int)auVar145._28_4_;
                  auVar113 = vpslld_avx(auVar114,0x17);
                  auVar86 = vpslld_avx(auVar126._16_16_,0x17);
                  auVar57._8_4_ = 0x3f800000;
                  auVar57._0_8_ = 0x3f8000003f800000;
                  auVar57._12_4_ = 0x3f800000;
                  auVar86 = vpaddd_avx(auVar86,auVar57);
                  auVar113 = vpaddd_avx(auVar113,auVar57);
                  auVar82._0_4_ =
                       (fVar112 + fVar49 +
                       fVar112 * fVar112 *
                       (fVar111 +
                       ((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) *
                         fVar112 + 0.041665796) * fVar112 + 0.16666666) * fVar112)) * auVar113._0_4_
                       + fVar49;
                  auVar82._4_4_ =
                       (fVar128 + fVar101 +
                       fVar128 * fVar128 *
                       (fVar127 +
                       ((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) *
                         fVar128 + 0.041665796) * fVar128 + 0.16666666) * fVar128)) * auVar113._4_4_
                       + fVar101;
                  auVar82._8_4_ =
                       (fVar130 + fVar15 +
                       fVar130 * fVar130 *
                       (fVar129 +
                       ((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) *
                         fVar130 + 0.041665796) * fVar130 + 0.16666666) * fVar130)) * auVar113._8_4_
                       + fVar15;
                  auVar82._12_4_ =
                       (fVar132 + fVar16 +
                       fVar132 * fVar132 *
                       (fVar131 +
                       ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                         fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132)) *
                       auVar113._12_4_ + fVar16;
                  auVar82._16_4_ =
                       (fVar134 + fVar55 +
                       fVar134 * fVar134 *
                       (fVar133 +
                       ((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) *
                         fVar134 + 0.041665796) * fVar134 + 0.16666666) * fVar134)) * auVar86._0_4_
                       + fVar55;
                  auVar82._20_4_ =
                       (fVar148 + fVar65 +
                       fVar148 * fVar148 *
                       (fVar135 +
                       ((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) *
                         fVar148 + 0.041665796) * fVar148 + 0.16666666) * fVar148)) * auVar86._4_4_
                       + fVar65;
                  auVar82._24_4_ =
                       (fVar154 + fVar66 +
                       fVar154 * fVar154 *
                       (fVar136 +
                       ((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) *
                         fVar154 + 0.041665796) * fVar154 + 0.16666666) * fVar154)) * auVar86._8_4_
                       + fVar66;
                  auVar82._28_4_ =
                       auVar100._28_4_ + auVar83._28_4_ + fVar67 + fVar141 + -0.47508308 + fVar67;
                  auVar83 = vrcpps_avx(auVar82);
                  in_ZMM7 = ZEXT3264(auVar83);
                  fVar49 = auVar83._0_4_;
                  fVar101 = auVar83._4_4_;
                  auVar20._4_4_ = auVar82._4_4_ * fVar101;
                  auVar20._0_4_ = auVar82._0_4_ * fVar49;
                  fVar15 = auVar83._8_4_;
                  auVar20._8_4_ = auVar82._8_4_ * fVar15;
                  fVar16 = auVar83._12_4_;
                  auVar20._12_4_ = auVar82._12_4_ * fVar16;
                  fVar55 = auVar83._16_4_;
                  auVar20._16_4_ = auVar82._16_4_ * fVar55;
                  fVar65 = auVar83._20_4_;
                  auVar20._20_4_ = auVar82._20_4_ * fVar65;
                  fVar66 = auVar83._24_4_;
                  auVar20._24_4_ = auVar82._24_4_ * fVar66;
                  auVar20._28_4_ = auVar82._28_4_;
                  auVar109 = vsubps_avx(auVar109,auVar20);
                  auVar145._0_4_ = fVar49 + fVar49 * auVar109._0_4_;
                  auVar145._4_4_ = fVar101 + fVar101 * auVar109._4_4_;
                  auVar145._8_4_ = fVar15 + fVar15 * auVar109._8_4_;
                  auVar145._12_4_ = fVar16 + fVar16 * auVar109._12_4_;
                  auVar145._16_4_ = fVar55 + fVar55 * auVar109._16_4_;
                  auVar145._20_4_ = fVar65 + fVar65 * auVar109._20_4_;
                  auVar145._24_4_ = fVar66 + fVar66 * auVar109._24_4_;
                  auVar145._28_4_ = auVar83._28_4_ + auVar109._28_4_;
                  break;
                case 5:
                  auVar145 = vminps_avx(auVar145,auVar138);
                  auVar83 = vmaxps_avx(auVar139,auVar145);
                  auVar122._0_4_ = fVar111 + auVar83._0_4_ * 1.442695;
                  auVar122._4_4_ = fVar127 + auVar83._4_4_ * 1.442695;
                  auVar122._8_4_ = fVar129 + auVar83._8_4_ * 1.442695;
                  auVar122._12_4_ = fVar131 + auVar83._12_4_ * 1.442695;
                  auVar122._16_4_ = fVar133 + auVar83._16_4_ * 1.442695;
                  auVar122._20_4_ = fVar135 + auVar83._20_4_ * 1.442695;
                  auVar122._24_4_ = fVar136 + auVar83._24_4_ * 1.442695;
                  auVar122._28_4_ = fVar141 + in_ZMM7._28_4_;
                  auVar100 = vroundps_avx(auVar122,1);
                  auVar145 = vcmpps_avx(auVar122,auVar100,1);
                  auVar145 = vandps_avx(auVar145,auVar109);
                  auVar145 = vsubps_avx(auVar100,auVar145);
                  auVar17._4_4_ = auVar145._4_4_ * 0.6931472;
                  auVar17._0_4_ = auVar145._0_4_ * 0.6931472;
                  auVar17._8_4_ = auVar145._8_4_ * 0.6931472;
                  auVar17._12_4_ = auVar145._12_4_ * 0.6931472;
                  auVar17._16_4_ = auVar145._16_4_ * 0.6931472;
                  auVar17._20_4_ = auVar145._20_4_ * 0.6931472;
                  auVar17._24_4_ = auVar145._24_4_ * 0.6931472;
                  auVar17._28_4_ = auVar100._28_4_;
                  auVar83 = vsubps_avx(auVar83,auVar17);
                  fVar148 = auVar83._0_4_;
                  fVar154 = auVar83._4_4_;
                  fVar155 = auVar83._8_4_;
                  fVar156 = auVar83._12_4_;
                  fVar157 = auVar83._16_4_;
                  fVar158 = auVar83._20_4_;
                  fVar159 = auVar83._24_4_;
                  auVar85._0_4_ = (int)auVar145._0_4_;
                  auVar85._4_4_ = (int)auVar145._4_4_;
                  auVar85._8_4_ = (int)auVar145._8_4_;
                  auVar85._12_4_ = (int)auVar145._12_4_;
                  auVar96._16_4_ = (int)auVar145._16_4_;
                  auVar96._0_16_ = auVar85;
                  auVar96._20_4_ = (int)auVar145._20_4_;
                  auVar96._24_4_ = (int)auVar145._24_4_;
                  auVar96._28_4_ = (int)auVar145._28_4_;
                  auVar113 = vpslld_avx(auVar85,0x17);
                  auVar86 = vpslld_avx(auVar96._16_16_,0x17);
                  auVar106._8_4_ = 0x3f800000;
                  auVar106._0_8_ = 0x3f8000003f800000;
                  auVar106._12_4_ = 0x3f800000;
                  auVar86 = vpaddd_avx(auVar86,auVar106);
                  auVar113 = vpaddd_avx(auVar113,auVar106);
                  auVar123._0_4_ =
                       (fVar148 + fVar49 +
                       fVar148 * fVar148 *
                       (((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) *
                          fVar148 + 0.041665796) * fVar148 + 0.16666666) * fVar148 + fVar111)) *
                       auVar113._0_4_ + fVar49;
                  auVar123._4_4_ =
                       (fVar154 + fVar101 +
                       fVar154 * fVar154 *
                       (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) *
                          fVar154 + 0.041665796) * fVar154 + 0.16666666) * fVar154 + fVar127)) *
                       auVar113._4_4_ + fVar101;
                  auVar123._8_4_ =
                       (fVar155 + fVar15 +
                       fVar155 * fVar155 *
                       (((((fVar155 * 0.00019875691 + 0.0013981999) * fVar155 + 0.008333452) *
                          fVar155 + 0.041665796) * fVar155 + 0.16666666) * fVar155 + fVar129)) *
                       auVar113._8_4_ + fVar15;
                  auVar123._12_4_ =
                       (fVar156 + fVar16 +
                       fVar156 * fVar156 *
                       (((((fVar156 * 0.00019875691 + 0.0013981999) * fVar156 + 0.008333452) *
                          fVar156 + 0.041665796) * fVar156 + 0.16666666) * fVar156 + fVar131)) *
                       auVar113._12_4_ + fVar16;
                  auVar123._16_4_ =
                       (fVar157 + fVar55 +
                       fVar157 * fVar157 *
                       (((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452) *
                          fVar157 + 0.041665796) * fVar157 + 0.16666666) * fVar157 + fVar133)) *
                       auVar86._0_4_ + fVar55;
                  auVar123._20_4_ =
                       (fVar158 + fVar65 +
                       fVar158 * fVar158 *
                       (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) *
                          fVar158 + 0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar135)) *
                       auVar86._4_4_ + fVar65;
                  auVar123._24_4_ =
                       (fVar159 + fVar66 +
                       fVar159 * fVar159 *
                       (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) *
                          fVar159 + 0.041665796) * fVar159 + 0.16666666) * fVar159 + fVar136)) *
                       auVar86._8_4_ + fVar66;
                  auVar123._28_4_ =
                       auVar83._28_4_ + fVar67 +
                       auVar107._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar141 + fVar67;
                  auVar51._8_4_ = 0x800000;
                  auVar51._0_8_ = 0x80000000800000;
                  auVar51._12_4_ = 0x800000;
                  auVar51._16_4_ = 0x800000;
                  auVar51._20_4_ = 0x800000;
                  auVar51._24_4_ = 0x800000;
                  auVar51._28_4_ = 0x800000;
                  auVar100 = vmaxps_avx(auVar123,auVar51);
                  auVar86 = vpsrld_avx(auVar100._16_16_,0x17);
                  auVar52._8_4_ = 0x807fffff;
                  auVar52._0_8_ = 0x807fffff807fffff;
                  auVar52._12_4_ = 0x807fffff;
                  auVar52._16_4_ = 0x807fffff;
                  auVar52._20_4_ = 0x807fffff;
                  auVar52._24_4_ = 0x807fffff;
                  auVar52._28_4_ = 0x807fffff;
                  auVar145 = vandps_avx(auVar100,auVar52);
                  auVar17 = vorps_avx(auVar145,auVar140._0_32_);
                  auVar53._8_4_ = 0x3f3504f3;
                  auVar53._0_8_ = 0x3f3504f33f3504f3;
                  auVar53._12_4_ = 0x3f3504f3;
                  auVar53._16_4_ = 0x3f3504f3;
                  auVar53._20_4_ = 0x3f3504f3;
                  auVar53._24_4_ = 0x3f3504f3;
                  auVar53._28_4_ = 0x3f3504f3;
                  auVar83 = vcmpps_avx(auVar53,auVar17,2);
                  auVar145 = vandnps_avx(auVar83,auVar17);
                  fVar148 = auVar17._0_4_ + -1.0 + auVar145._0_4_;
                  fVar154 = auVar17._4_4_ + -1.0 + auVar145._4_4_;
                  fVar155 = auVar17._8_4_ + -1.0 + auVar145._8_4_;
                  fVar156 = auVar17._12_4_ + -1.0 + auVar145._12_4_;
                  fVar157 = auVar17._16_4_ + -1.0 + auVar145._16_4_;
                  fVar158 = auVar17._20_4_ + -1.0 + auVar145._20_4_;
                  fVar159 = auVar17._24_4_ + -1.0 + auVar145._24_4_;
                  auVar86 = vpsubd_avx(auVar86,auVar83._16_16_);
                  auVar113 = vpsrld_avx(auVar100._0_16_,0x17);
                  auVar50._8_4_ = 0xffffff81;
                  auVar50._0_8_ = 0xffffff81ffffff81;
                  auVar50._12_4_ = 0xffffff81;
                  auVar86 = vpaddd_avx(auVar86,auVar50);
                  auVar113 = vpsubd_avx(auVar113,auVar83._0_16_);
                  auVar113 = vpaddd_avx(auVar113,auVar50);
                  auVar80._16_16_ = auVar86;
                  auVar80._0_16_ = auVar113;
                  auVar54 = ZEXT864(0) << 0x20;
                  auVar83 = vcmpps_avx(auVar123,ZEXT832(0) << 0x20,2);
                  auVar100 = vcvtdq2ps_avx(auVar80);
                  auVar18._4_4_ =
                       (fVar154 + auVar100._4_4_ * 0.6931472 +
                       fVar154 * fVar154 *
                       (fVar154 * (fVar154 * (fVar154 * (fVar154 * (fVar154 * (fVar154 * (fVar154 * 
                                                  (fVar154 * (fVar154 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar18._0_4_ =
                       (fVar148 + auVar100._0_4_ * 0.6931472 +
                       fVar148 * fVar148 *
                       (fVar148 * (fVar148 * (fVar148 * (fVar148 * (fVar148 * (fVar148 * (fVar148 * 
                                                  (fVar148 * (fVar148 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar18._8_4_ =
                       (fVar155 + auVar100._8_4_ * 0.6931472 +
                       fVar155 * fVar155 *
                       (fVar155 * (fVar155 * (fVar155 * (fVar155 * (fVar155 * (fVar155 * (fVar155 * 
                                                  (fVar155 * (fVar155 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar18._12_4_ =
                       (fVar156 + auVar100._12_4_ * 0.6931472 +
                       fVar156 * fVar156 *
                       (fVar156 * (fVar156 * (fVar156 * (fVar156 * (fVar156 * (fVar156 * (fVar156 * 
                                                  (fVar156 * (fVar156 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar18._16_4_ =
                       (fVar157 + auVar100._16_4_ * 0.6931472 +
                       fVar157 * fVar157 *
                       (fVar157 * (fVar157 * (fVar157 * (fVar157 * (fVar157 * (fVar157 * (fVar157 * 
                                                  (fVar157 * (fVar157 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar18._20_4_ =
                       (fVar158 + auVar100._20_4_ * 0.6931472 +
                       fVar158 * fVar158 *
                       (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * 
                                                  (fVar158 * (fVar158 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar18._24_4_ =
                       (fVar159 + auVar100._24_4_ * 0.6931472 +
                       fVar159 * fVar159 *
                       (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * 
                                                  (fVar159 * (fVar159 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar18._28_4_ = auVar17._28_4_ + -1.0 + auVar145._28_4_ + auVar100._28_4_ + 0.0;
                  auVar97._8_4_ = 0x7fffffff;
                  auVar97._0_8_ = 0x7fffffff7fffffff;
                  auVar97._12_4_ = 0x7fffffff;
                  auVar97._16_4_ = 0x7fffffff;
                  auVar97._20_4_ = 0x7fffffff;
                  auVar97._24_4_ = 0x7fffffff;
                  auVar97._28_4_ = 0x7fffffff;
                  auVar145 = vblendvps_avx(auVar18,auVar97,auVar83);
                  auVar145 = vminps_avx(auVar138,auVar145);
                  auVar83 = vmaxps_avx(auVar139,auVar145);
                  auVar98._0_4_ = auVar83._0_4_ * 1.442695 + fVar111;
                  auVar98._4_4_ = auVar83._4_4_ * 1.442695 + fVar127;
                  auVar98._8_4_ = auVar83._8_4_ * 1.442695 + fVar129;
                  auVar98._12_4_ = auVar83._12_4_ * 1.442695 + fVar131;
                  auVar98._16_4_ = auVar83._16_4_ * 1.442695 + fVar133;
                  auVar98._20_4_ = auVar83._20_4_ * 1.442695 + fVar135;
                  auVar98._24_4_ = auVar83._24_4_ * 1.442695 + fVar136;
                  auVar98._28_4_ = fVar141 + NAN;
                  auVar100 = vroundps_avx(auVar98,1);
                  auVar145 = vcmpps_avx(auVar98,auVar100,1);
                  auVar145 = vandps_avx(auVar145,auVar109);
                  auVar145 = vsubps_avx(auVar100,auVar145);
                  auVar19._4_4_ = auVar145._4_4_ * 0.6931472;
                  auVar19._0_4_ = auVar145._0_4_ * 0.6931472;
                  auVar19._8_4_ = auVar145._8_4_ * 0.6931472;
                  auVar19._12_4_ = auVar145._12_4_ * 0.6931472;
                  auVar19._16_4_ = auVar145._16_4_ * 0.6931472;
                  auVar19._20_4_ = auVar145._20_4_ * 0.6931472;
                  auVar19._24_4_ = auVar145._24_4_ * 0.6931472;
                  auVar19._28_4_ = auVar100._28_4_;
                  auVar83 = vsubps_avx(auVar83,auVar19);
                  fVar148 = auVar83._0_4_;
                  fVar154 = auVar83._4_4_;
                  fVar155 = auVar83._8_4_;
                  fVar156 = auVar83._12_4_;
                  fVar157 = auVar83._16_4_;
                  fVar158 = auVar83._20_4_;
                  fVar159 = auVar83._24_4_;
                  auVar110 = ZEXT3264(auVar109);
                  auVar140 = ZEXT3264(auVar140._0_32_);
                  fVar111 = fVar111 + ((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 +
                                        0.008333452) * fVar148 + 0.041665796) * fVar148 + 0.16666666
                                      ) * fVar148;
                  fVar127 = fVar127 + ((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 +
                                        0.008333452) * fVar154 + 0.041665796) * fVar154 + 0.16666666
                                      ) * fVar154;
                  fVar129 = fVar129 + ((((fVar155 * 0.00019875691 + 0.0013981999) * fVar155 +
                                        0.008333452) * fVar155 + 0.041665796) * fVar155 + 0.16666666
                                      ) * fVar155;
                  fVar131 = fVar131 + ((((fVar156 * 0.00019875691 + 0.0013981999) * fVar156 +
                                        0.008333452) * fVar156 + 0.041665796) * fVar156 + 0.16666666
                                      ) * fVar156;
                  fVar133 = fVar133 + ((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 +
                                        0.008333452) * fVar157 + 0.041665796) * fVar157 + 0.16666666
                                      ) * fVar157;
                  fVar135 = fVar135 + ((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 +
                                        0.008333452) * fVar158 + 0.041665796) * fVar158 + 0.16666666
                                      ) * fVar158;
                  fVar136 = fVar136 + ((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 +
                                        0.008333452) * fVar159 + 0.041665796) * fVar159 + 0.16666666
                                      ) * fVar159;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar141 + auVar123._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar136,CONCAT420(fVar135,CONCAT416(fVar133
                                                  ,CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(
                                                  fVar127,fVar111))))))));
                  auVar87._0_4_ = (int)auVar145._0_4_;
                  auVar87._4_4_ = (int)auVar145._4_4_;
                  auVar87._8_4_ = (int)auVar145._8_4_;
                  auVar87._12_4_ = (int)auVar145._12_4_;
                  auVar99._16_4_ = (int)auVar145._16_4_;
                  auVar99._0_16_ = auVar87;
                  auVar99._20_4_ = (int)auVar145._20_4_;
                  auVar99._24_4_ = (int)auVar145._24_4_;
                  auVar99._28_4_ = (int)auVar145._28_4_;
                  auVar113 = vpslld_avx(auVar87,0x17);
                  auVar86 = vpslld_avx(auVar99._16_16_,0x17);
                  auVar56._8_4_ = 0x3f800000;
                  auVar56._0_8_ = 0x3f8000003f800000;
                  auVar56._12_4_ = 0x3f800000;
                  auVar86 = vpaddd_avx(auVar86,auVar56);
                  auVar113 = vpaddd_avx(auVar113,auVar56);
                  auVar81._0_4_ =
                       (fVar148 + fVar49 + fVar148 * fVar148 * fVar111) * auVar113._0_4_ + fVar49;
                  auVar81._4_4_ =
                       (fVar154 + fVar101 + fVar154 * fVar154 * fVar127) * auVar113._4_4_ + fVar101;
                  auVar81._8_4_ =
                       (fVar155 + fVar15 + fVar155 * fVar155 * fVar129) * auVar113._8_4_ + fVar15;
                  auVar81._12_4_ =
                       (fVar156 + fVar16 + fVar156 * fVar156 * fVar131) * auVar113._12_4_ + fVar16;
                  auVar81._16_4_ =
                       (fVar157 + fVar55 + fVar157 * fVar157 * fVar133) * auVar86._0_4_ + fVar55;
                  auVar81._20_4_ =
                       (fVar158 + fVar65 + fVar158 * fVar158 * fVar135) * auVar86._4_4_ + fVar65;
                  auVar81._24_4_ =
                       (fVar159 + fVar66 + fVar159 * fVar159 * fVar136) * auVar86._8_4_ + fVar66;
                  auVar81._28_4_ = auVar83._28_4_ + fVar67 + auVar100._28_4_ + fVar67;
                  auVar145 = vrcpps_avx(auVar81);
                  fVar49 = auVar145._0_4_;
                  fVar101 = auVar145._4_4_;
                  fVar15 = auVar145._8_4_;
                  fVar16 = auVar145._12_4_;
                  fVar55 = auVar145._16_4_;
                  fVar65 = auVar145._20_4_;
                  fVar66 = auVar145._24_4_;
                  auVar109._4_4_ = auVar81._4_4_ * (fVar101 + fVar101);
                  auVar109._0_4_ = auVar81._0_4_ * (fVar49 + fVar49);
                  auVar109._8_4_ = auVar81._8_4_ * (fVar15 + fVar15);
                  auVar109._12_4_ = auVar81._12_4_ * (fVar16 + fVar16);
                  auVar109._16_4_ = auVar81._16_4_ * (fVar55 + fVar55);
                  auVar109._20_4_ = auVar81._20_4_ * (fVar65 + fVar65);
                  auVar109._24_4_ = auVar81._24_4_ * (fVar66 + fVar66);
                  auVar109._28_4_ = auVar81._28_4_;
                  auVar62._8_4_ = 0x40000000;
                  auVar62._0_8_ = 0x4000000040000000;
                  auVar62._12_4_ = 0x40000000;
                  auVar62._16_4_ = 0x40000000;
                  auVar62._20_4_ = 0x40000000;
                  auVar62._24_4_ = 0x40000000;
                  auVar62._28_4_ = 0x40000000;
                  auVar109 = vsubps_avx(auVar62,auVar109);
                  auVar100._0_4_ = fVar49 + fVar49 + -1.0;
                  auVar100._4_4_ = fVar101 + fVar101 + -1.0;
                  auVar100._8_4_ = fVar15 + fVar15 + -1.0;
                  auVar100._12_4_ = fVar16 + fVar16 + -1.0;
                  auVar100._16_4_ = fVar55 + fVar55 + -1.0;
                  auVar100._20_4_ = fVar65 + fVar65 + -1.0;
                  auVar100._24_4_ = fVar66 + fVar66 + -1.0;
                  auVar100._28_4_ = auVar145._28_4_ + auVar145._28_4_ + -1.0;
                  auVar79._0_4_ = auVar100._0_4_ + fVar49 * auVar109._0_4_;
                  auVar79._4_4_ = auVar100._4_4_ + fVar101 * auVar109._4_4_;
                  auVar79._8_4_ = auVar100._8_4_ + fVar15 * auVar109._8_4_;
                  auVar79._12_4_ = auVar100._12_4_ + fVar16 * auVar109._12_4_;
                  auVar79._16_4_ = auVar100._16_4_ + fVar55 * auVar109._16_4_;
                  auVar79._20_4_ = auVar100._20_4_ + fVar65 * auVar109._20_4_;
                  auVar79._24_4_ = auVar100._24_4_ + fVar66 * auVar109._24_4_;
                  goto LAB_0045aeda;
                case 6:
                  fVar49 = **(float **)(&this->field_0x120 + (long)p_Var31);
                  fVar101 = (*(float **)(&this->field_0x120 + (long)p_Var31))[1];
                  auVar100._4_4_ = fVar101;
                  auVar100._0_4_ = fVar101;
                  auVar100._8_4_ = fVar101;
                  auVar100._12_4_ = fVar101;
                  auVar100._16_4_ = fVar101;
                  auVar100._20_4_ = fVar101;
                  auVar100._24_4_ = fVar101;
                  auVar100._28_4_ = fVar101;
                  auVar83._0_4_ = auVar146._0_4_ * fVar49 + fVar101;
                  auVar83._4_4_ = auVar146._4_4_ * fVar49 + fVar101;
                  auVar83._8_4_ = fVar112 * fVar49 + fVar101;
                  auVar83._12_4_ = fVar128 * fVar49 + fVar101;
                  auVar83._16_4_ = fVar130 * fVar49 + fVar101;
                  auVar83._20_4_ = fVar132 * fVar49 + fVar101;
                  auVar83._24_4_ = fVar134 * fVar49 + fVar101;
                  auVar83._28_4_ = fVar49 + fVar101;
                  auVar145 = vmaxps_avx(auVar83,auVar54._0_32_);
                  auVar145 = vminps_avx(auVar145,auVar109);
                  auVar79 = auVar145._0_28_;
LAB_0045aeda:
                  auVar107 = ZEXT3264(auVar100);
                  auVar147._0_4_ = auVar146._0_4_ * auVar79._0_4_;
                  auVar147._4_4_ = auVar146._4_4_ * auVar79._4_4_;
                  auVar147._8_4_ = fVar112 * auVar79._8_4_;
                  auVar147._12_4_ = fVar128 * auVar79._12_4_;
                  auVar147._16_4_ = fVar130 * auVar79._16_4_;
                  auVar147._20_4_ = fVar132 * auVar79._20_4_;
                  auVar147._24_4_ = fVar134 * auVar79._24_4_;
                  auVar145 = auVar147._0_32_;
                }
                *pauVar42 = auVar145;
                pauVar42 = pauVar42 + 1;
                iVar33 = iVar33 + 1;
                local_278 = local_278 + 1;
              } while (iVar33 != _w);
            }
            iVar28 = iVar28 + 1;
          } while (iVar28 != _h);
        }
        local_2a8 = local_2a8 + 1;
      } while (local_2a8 != uVar35);
    }
LAB_0045c088:
    pMVar21 = local_170;
    local_1e8 = pvVar41;
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx +
               (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]),&local_238,local_170,opt);
    if ((pMVar21->data != (void *)0x0) && (iVar40 = 0, (long)pMVar21->c * pMVar21->cstep != 0))
    goto LAB_0045c11b;
  }
  else {
    uVar46 = iVar23 / iVar40;
    uVar29 = *(int *)(&this->field_0xd0 + (long)p_Var31) / iVar40;
    local_2b8 = 1;
    _elempack = 1;
    if (opt->use_packing_layout == true) {
      local_2b8 = (uint)((uVar46 & 3) == 0) * 3 + 1;
      if ((uVar46 & 7) == 0) {
        local_2b8 = 8;
      }
      _elempack = (uint)((uVar29 & 3) == 0) * 3 + 1;
      if ((uVar29 & 7) == 0) {
        _elempack = 8;
      }
    }
    piVar12 = bottom_blob->refcount;
    local_168.data = bottom_blob->data;
    local_168.refcount = bottom_blob->refcount;
    local_168.elemsize = bottom_blob->elemsize;
    local_168.elempack = bottom_blob->elempack;
    local_168.allocator = bottom_blob->allocator;
    local_168.dims = bottom_blob->dims;
    local_168.w = bottom_blob->w;
    local_168.h = bottom_blob->h;
    local_168.d = bottom_blob->d;
    local_168.c = bottom_blob->c;
    local_168.cstep = bottom_blob->cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    if (local_2b8 < iVar39) {
      local_1b8.data = *(void **)opt;
      local_1b8.elemsize = (size_t)opt->workspace_allocator;
      local_1b8.elempack = opt->openmp_blocktime;
      local_1b8._28_1_ = opt->use_winograd_convolution;
      local_1b8._29_1_ = opt->use_sgemm_convolution;
      local_1b8._30_1_ = opt->use_int8_inference;
      local_1b8._31_1_ = opt->use_vulkan_compute;
      local_1b8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1b8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      local_1b8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1b8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1b8.refcount = (int *)opt->workspace_allocator;
      convert_packing(bottom_blob,&local_168,local_2b8,(Option *)&local_1b8);
    }
    piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    local_1b8.refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    local_1b8.data = local_238.data;
    local_1b8.elemsize = local_238.elemsize;
    local_1b8.elempack = local_238.elempack;
    local_1b8.allocator = local_238.allocator;
    local_1b8.w = local_238.w;
    local_1b8.dims = local_238.dims;
    local_1b8.h = local_238.h;
    local_1b8.d = local_238.d;
    local_1b8.c = local_238.c;
    local_1b8.cstep = local_238.cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    pp_Var32 = this->_vptr_DeconvolutionDepthWise_x86_avx;
    if (uVar24 <= _elempack) {
LAB_0045b154:
      if (0 < *(int *)(&this->field_0x114 + (long)pp_Var32[-3])) {
        local_1e8._0_4_ = (int)uVar46 / local_2b8;
        iVar28 = 0;
        iVar39 = 0;
        lVar36 = 0;
        do {
          local_c0 = (void *)((long)(iVar28 / local_2b8) * local_168.cstep * local_168.elemsize +
                             (long)local_168.data);
          local_b8 = (int *)0x0;
          local_b0 = local_168.elemsize;
          local_a8 = local_168.elempack;
          local_a0 = local_168.allocator;
          local_88 = (int)local_1e8;
          local_80 = ((long)local_168.d * local_168.elemsize * (long)local_168.h * (long)local_168.w
                      + 0xf & 0xfffffffffffffff0) / local_168.elemsize;
          local_98 = local_168.dims;
          iStack_94 = local_168.w;
          iStack_90 = local_168.h;
          iStack_8c = local_168.d;
          local_108 = (void *)((long)(iVar39 / (int)_elempack) * local_1b8.cstep *
                               local_1b8.elemsize + (long)local_1b8.data);
          local_100 = (int *)0x0;
          local_f8 = local_1b8.elemsize;
          local_f0 = local_1b8.elempack;
          local_e8 = local_1b8.allocator;
          local_c8 = ((long)local_1b8.d * local_1b8.elemsize * (long)local_1b8.h * (long)local_1b8.w
                      + 0xf & 0xfffffffffffffff0) / local_1b8.elemsize;
          local_e0 = local_1b8.dims;
          iStack_dc = local_1b8.w;
          iStack_d8 = local_1b8.h;
          iStack_d4 = local_1b8.d;
          pLVar14 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar36];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          pAStack_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_reserved_6;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          pAStack_70 = local_1b8.allocator;
          local_d0 = (int)uVar29 / (int)_elempack;
          (*pLVar14->_vptr_Layer[7])(pLVar14,&local_c0,&local_108,&local_78);
          if (local_100 != (int *)0x0) {
            LOCK();
            *local_100 = *local_100 + -1;
            UNLOCK();
            if (*local_100 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (**(code **)(*(long *)local_e8 + 0x18))();
              }
            }
          }
          if (local_b8 != (int *)0x0) {
            LOCK();
            *local_b8 = *local_b8 + -1;
            UNLOCK();
            if (*local_b8 == 0) {
              if (local_a0 == (Allocator *)0x0) {
                if (local_c0 != (void *)0x0) {
                  free(local_c0);
                }
              }
              else {
                (**(code **)(*(long *)local_a0 + 0x18))();
              }
            }
          }
          lVar36 = lVar36 + 1;
          iVar39 = iVar39 + uVar29;
          iVar28 = iVar28 + uVar46;
        } while (lVar36 < *(int *)(&this->field_0x114 +
                                  (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      }
      if (_elempack < uVar24) {
        convert_packing(&local_1b8,&local_238,uVar24,opt);
      }
      else {
        if (local_1b8.refcount != (int *)0x0) {
          LOCK();
          *local_1b8.refcount = *local_1b8.refcount + 1;
          UNLOCK();
        }
        piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_238.allocator == (Allocator *)0x0) {
              if (local_238.data != (void *)0x0) {
                free(local_238.data);
              }
            }
            else {
              (**(code **)(*(long *)local_238.allocator + 0x18))();
            }
          }
        }
        local_238.data = local_1b8.data;
        local_238.refcount._0_4_ = SUB84(local_1b8.refcount,0);
        local_238.refcount._4_4_ = (undefined4)((ulong)local_1b8.refcount >> 0x20);
        local_238.elemsize = local_1b8.elemsize;
        local_238.elempack = local_1b8.elempack;
        local_238.allocator = local_1b8.allocator;
        local_238.dims = local_1b8.dims;
        local_238.w = local_1b8.w;
        local_238.h = local_1b8.h;
        local_238.d = local_1b8.d;
        local_238.c = local_1b8.c;
        local_238.cstep = local_1b8.cstep;
      }
      if (local_1b8.refcount != (int *)0x0) {
        LOCK();
        *local_1b8.refcount = *local_1b8.refcount + -1;
        UNLOCK();
        if (*local_1b8.refcount == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (**(code **)(*(long *)local_1b8.allocator + 0x18))();
          }
        }
      }
      pvVar41 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
      if (local_168.refcount != (int *)0x0) {
        LOCK();
        *local_168.refcount = *local_168.refcount + -1;
        UNLOCK();
        pvVar41 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
        if (*local_168.refcount == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            pvVar41 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
              pvVar41 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
            }
          }
          else {
            (**(code **)(*(long *)local_168.allocator + 0x18))();
            pvVar41 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
          }
        }
      }
      goto LAB_0045c088;
    }
    Mat::create(&local_1b8,_w,_h,*(int *)(&this->field_0xd0 + (long)pp_Var32[-3]) / (int)_elempack,
                (ulong)_elempack * (sVar47 / uVar24),_elempack,opt->workspace_allocator);
    if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
      pp_Var32 = this->_vptr_DeconvolutionDepthWise_x86_avx;
      goto LAB_0045b154;
    }
    if (local_1b8.refcount != (int *)0x0) {
      LOCK();
      *local_1b8.refcount = *local_1b8.refcount + -1;
      UNLOCK();
      if (*local_1b8.refcount == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_1b8.allocator + 0x18))();
        }
      }
    }
    local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (**(code **)(*(long *)local_168.allocator + 0x18))();
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,(int)local_1e8);
        }
      }
    }
  }
  iVar40 = -100;
LAB_0045c11b:
  piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (**(code **)(*(long *)local_238.allocator + 0x18))();
      }
    }
  }
  return iVar40;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}